

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O3

KBOOL __thiscall KDIS::PDU::Detonation_PDU::operator==(Detonation_PDU *this,Detonation_PDU *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  KBOOL KVar3;
  pointer pKVar4;
  VariableParameter **ppVVar5;
  bool bVar6;
  
  KVar3 = Warfare_Header::operator!=(&this->super_Warfare_Header,&Value->super_Warfare_Header);
  if ((((!KVar3) &&
       (KVar3 = DATA_TYPE::Vector::operator!=(&this->m_Velocity,&Value->m_Velocity), !KVar3)) &&
      (KVar3 = DATA_TYPE::WorldCoordinates::operator!=
                         (&this->m_LocationWorldCoords,&Value->m_LocationWorldCoords), !KVar3)) &&
     (((KVar3 = DATA_TYPE::Descriptor::operator!=
                          ((this->m_pDescriptor).m_pRef,(Value->m_pDescriptor).m_pRef), !KVar3 &&
       (KVar3 = DATA_TYPE::Vector::operator!=
                          (&this->m_LocationEntityCoords,&Value->m_LocationEntityCoords), !KVar3))
      && ((this->m_ui8DetonationResult == Value->m_ui8DetonationResult &&
          (this->m_ui8NumOfVariableParams == Value->m_ui8NumOfVariableParams)))))) {
    pKVar1 = (this->m_vVariableParameters).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pKVar2 = (this->m_vVariableParameters).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pKVar4 = (Value->m_vVariableParameters).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pKVar2 - (long)pKVar1 ==
        (long)(Value->m_vVariableParameters).
              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar4) {
      if (pKVar1 == pKVar2) {
        return true;
      }
      ppVVar5 = &pKVar4->m_pRef;
      do {
        pKVar4 = pKVar1 + 1;
        bVar6 = pKVar1->m_pRef == *ppVVar5;
        if (!bVar6) {
          return bVar6;
        }
        ppVVar5 = ppVVar5 + 3;
        pKVar1 = pKVar4;
      } while (pKVar4 != pKVar2);
      return bVar6;
    }
  }
  return false;
}

Assistant:

KBOOL Detonation_PDU::operator == ( const Detonation_PDU & Value ) const
{
    if( Warfare_Header::operator !=( Value ) )                       return false;
    if( m_Velocity               != Value.m_Velocity )               return false;
    if( m_LocationWorldCoords    != Value.m_LocationWorldCoords )    return false;
    if( *m_pDescriptor           != *Value.m_pDescriptor )          return false;
    if( m_LocationEntityCoords   != Value.m_LocationEntityCoords )   return false;
    if( m_ui8DetonationResult    != Value.m_ui8DetonationResult )    return false;
    if( m_ui8NumOfVariableParams != Value.m_ui8NumOfVariableParams ) return false;
    if( m_vVariableParameters    != Value.m_vVariableParameters )    return false;
    return true;
}